

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_copy_and_apply_volume_factor_s24
               (void *pSamplesOut,void *pSamplesIn,ma_uint64 sampleCount,float factor)

{
  int iVar1;
  ma_int32 sampleS32;
  ma_uint8 *pSamplesIn8;
  ma_uint8 *pSamplesOut8;
  ma_uint64 iSample;
  float factor_local;
  ma_uint64 sampleCount_local;
  void *pSamplesIn_local;
  void *pSamplesOut_local;
  
  if ((pSamplesOut != (void *)0x0) && (pSamplesIn != (void *)0x0)) {
    for (pSamplesOut8 = (ma_uint8 *)0x0; pSamplesOut8 < sampleCount; pSamplesOut8 = pSamplesOut8 + 1
        ) {
      iVar1 = (int)((float)(int)((uint)*(byte *)((long)pSamplesIn + (long)pSamplesOut8 * 3) << 8 |
                                 (uint)*(byte *)((long)pSamplesIn + (long)pSamplesOut8 * 3 + 1) <<
                                 0x10 | (uint)*(byte *)((long)pSamplesIn +
                                                       (long)pSamplesOut8 * 3 + 2) << 0x18) * factor
                   );
      *(char *)((long)pSamplesOut + (long)pSamplesOut8 * 3) = (char)((uint)iVar1 >> 8);
      *(char *)((long)pSamplesOut + (long)pSamplesOut8 * 3 + 1) = (char)((uint)iVar1 >> 0x10);
      *(char *)((long)pSamplesOut + (long)pSamplesOut8 * 3 + 2) = (char)((uint)iVar1 >> 0x18);
    }
  }
  return;
}

Assistant:

MA_API void ma_copy_and_apply_volume_factor_s24(void* pSamplesOut, const void* pSamplesIn, ma_uint64 sampleCount, float factor)
{
    ma_uint64 iSample;
    ma_uint8* pSamplesOut8;
    ma_uint8* pSamplesIn8;

    if (pSamplesOut == NULL || pSamplesIn == NULL) {
        return;
    }

    pSamplesOut8 = (ma_uint8*)pSamplesOut;
    pSamplesIn8  = (ma_uint8*)pSamplesIn;

    for (iSample = 0; iSample < sampleCount; iSample += 1) {
        ma_int32 sampleS32;

        sampleS32 = (ma_int32)(((ma_uint32)(pSamplesIn8[iSample*3+0]) << 8) | ((ma_uint32)(pSamplesIn8[iSample*3+1]) << 16) | ((ma_uint32)(pSamplesIn8[iSample*3+2])) << 24);
        sampleS32 = (ma_int32)(sampleS32 * factor);

        pSamplesOut8[iSample*3+0] = (ma_uint8)(((ma_uint32)sampleS32 & 0x0000FF00) >>  8);
        pSamplesOut8[iSample*3+1] = (ma_uint8)(((ma_uint32)sampleS32 & 0x00FF0000) >> 16);
        pSamplesOut8[iSample*3+2] = (ma_uint8)(((ma_uint32)sampleS32 & 0xFF000000) >> 24);
    }
}